

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hebrwcal.cpp
# Opt level: O2

int32_t __thiscall icu_63::HebrewCalendar::handleGetExtendedYear(HebrewCalendar *this)

{
  UCalendarDateFields UVar1;
  int32_t iVar2;
  
  iVar2 = 1;
  UVar1 = Calendar::newerField(&this->super_Calendar,UCAL_EXTENDED_YEAR,UCAL_YEAR);
  if (UVar1 == UCAL_EXTENDED_YEAR) {
    if (0 < (this->super_Calendar).fStamp[0x13]) {
      iVar2 = (this->super_Calendar).fFields[0x13];
    }
  }
  else if (0 < (this->super_Calendar).fStamp[1]) {
    iVar2 = (this->super_Calendar).fFields[1];
  }
  return iVar2;
}

Assistant:

int32_t HebrewCalendar::handleGetExtendedYear() {
    int32_t year;
    if (newerField(UCAL_EXTENDED_YEAR, UCAL_YEAR) == UCAL_EXTENDED_YEAR) {
        year = internalGet(UCAL_EXTENDED_YEAR, 1); // Default to year 1
    } else {
        year = internalGet(UCAL_YEAR, 1); // Default to year 1
    }
    return year;
}